

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_optimize.cc
# Opt level: O2

void __thiscall pass_insert_sync_reset_Test::TestBody(pass_insert_sync_reset_Test *this)

{
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *p_Var1;
  IfStmt *pIVar2;
  undefined1 auVar3 [8];
  undefined8 uVar4;
  Generator *pGVar5;
  Port *pPVar6;
  Port *pPVar7;
  Var *pVVar8;
  Var *var;
  Const *right;
  iterator iVar9;
  mapped_type *pmVar10;
  long lVar11;
  Generator *top;
  char *in_R9;
  enable_shared_from_this<kratos::Var> *__r;
  undefined1 local_260 [8];
  Context c;
  undefined1 local_138 [8];
  shared_ptr<kratos::Attribute> attr;
  AssertHelper local_120;
  Port *local_118;
  Var *local_110;
  AssertHelper local_108;
  AssertionResult gtest_ar__6;
  undefined1 auStack_e8 [8];
  AssertionResult gtest_ar__5;
  undefined1 auStack_c8 [8];
  mapped_type src_child;
  mapped_type src_child2;
  undefined1 local_80 [8];
  mapped_type src_parent;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  src;
  
  kratos::Context::Context((Context *)local_260);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"parent",(allocator<char> *)local_80);
  pGVar5 = kratos::Context::generator
                     ((Context *)local_260,(string *)((long)&src_parent.field_2 + 8));
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"clk",(allocator<char> *)local_80);
  pPVar6 = kratos::Generator::port(pGVar5,In,(string *)((long)&src_parent.field_2 + 8),1,Clock);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"rst",(allocator<char> *)local_80);
  local_118 = kratos::Generator::port
                        (pGVar5,In,(string *)((long)&src_parent.field_2 + 8),1,AsyncReset);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"clk_en",(allocator<char> *)local_80);
  pPVar7 = kratos::Generator::port
                     (pGVar5,In,(string *)((long)&src_parent.field_2 + 8),1,ClockEnable);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"a",(allocator<char> *)local_80);
  kratos::Generator::port(pGVar5,Out,(string *)((long)&src_parent.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"b",(allocator<char> *)local_80);
  src_child2.field_2._8_8_ = pGVar5;
  pVVar8 = kratos::Generator::var(pGVar5,(string *)((long)&src_parent.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"c",(allocator<char> *)local_80);
  local_110 = kratos::Generator::var
                        ((Generator *)src_child2.field_2._8_8_,
                         (string *)((long)&src_parent.field_2 + 8),1);
  c.tracked_generators_._M_h._M_single_bucket = (__node_base_ptr)pPVar7;
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  kratos::Generator::sequential((Generator *)local_80);
  auVar3 = local_80;
  __r = &(pPVar6->super_Var).super_enable_shared_from_this<kratos::Var>;
  attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)pPVar6;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_c8,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)__r);
  src_parent.field_2._8_4_ = 0;
  src._M_t._M_impl._0_8_ = auStack_c8;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = src_child._M_dataplus._M_p;
  auStack_c8 = (undefined1  [8])0x0;
  src_child._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)auVar3,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&src_parent.field_2 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src._M_t._M_impl.super__Rb_tree_header);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)((long)&src_parent.field_2 + 8));
  pIVar2 = (IfStmt *)CONCAT44(src_parent.field_2._12_4_,src_parent.field_2._8_4_);
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)((long)&src_child.field_2 + 8),pVVar8);
  auStack_c8 = (undefined1  [8])src_child.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_child.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt(pIVar2,(shared_ptr<kratos::Stmt> *)auStack_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  pIVar2 = (IfStmt *)CONCAT44(src_parent.field_2._12_4_,src_parent.field_2._8_4_);
  kratos::Var::assign((Var *)((long)&src_child.field_2 + 8),local_110);
  auStack_c8 = (undefined1  [8])src_child.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_child.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_else_stmt(pIVar2,(shared_ptr<kratos::Stmt> *)auStack_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  auVar3 = local_80;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_c8,
             (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&src_parent.field_2 + 8));
  kratos::StmtBlock::add_stmt((StmtBlock *)auVar3,(shared_ptr<kratos::Stmt> *)auStack_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_parent);
  kratos::Generator::sequential((Generator *)local_80);
  auVar3 = local_80;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_c8,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)__r);
  src_parent.field_2._8_4_ = 0;
  src._M_t._M_impl._0_8_ = auStack_c8;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = src_child._M_dataplus._M_p;
  auStack_c8 = (undefined1  [8])0x0;
  src_child._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)auVar3,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&src_parent.field_2 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src._M_t._M_impl.super__Rb_tree_header);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)((long)&src_parent.field_2 + 8));
  pIVar2 = (IfStmt *)CONCAT44(src_parent.field_2._12_4_,src_parent.field_2._8_4_);
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)((long)&src_child.field_2 + 8),pVVar8);
  auStack_c8 = (undefined1  [8])src_child.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_child.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt(pIVar2,(shared_ptr<kratos::Stmt> *)auStack_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)auStack_c8);
  auVar3 = auStack_c8;
  kratos::Var::assign((Var *)auStack_e8,local_110);
  src_child.field_2._8_8_ = auStack_e8;
  src_child2._M_dataplus._M_p = (pointer)gtest_ar__5._0_8_;
  auStack_e8 = (undefined1  [8])0x0;
  gtest_ar__5.success_ = false;
  gtest_ar__5._1_7_ = 0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)auVar3,(shared_ptr<kratos::Stmt> *)((long)&src_child.field_2 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar__5);
  pIVar2 = (IfStmt *)CONCAT44(src_parent.field_2._12_4_,src_parent.field_2._8_4_);
  p_Var1 = (__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)((long)&src_child.field_2 + 8);
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            (p_Var1,(__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)auStack_c8);
  kratos::IfStmt::add_else_stmt(pIVar2,(shared_ptr<kratos::Stmt> *)p_Var1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  auVar3 = local_80;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            (p_Var1,(__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&src_parent.field_2 + 8));
  kratos::StmtBlock::add_stmt((StmtBlock *)auVar3,(shared_ptr<kratos::Stmt> *)p_Var1);
  uVar4 = src_child2.field_2._8_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_parent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"child",(allocator<char> *)local_80);
  pGVar5 = kratos::Context::generator
                     ((Context *)local_260,(string *)((long)&src_parent.field_2 + 8));
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"child",(allocator<char> *)auStack_c8);
  std::__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<kratos::Generator,void>
            ((__shared_ptr<kratos::Generator,(__gnu_cxx::_Lock_policy)2> *)local_80,
             (__weak_ptr<kratos::Generator,_(__gnu_cxx::_Lock_policy)2> *)
             &pGVar5->super_enable_shared_from_this<kratos::Generator>);
  kratos::Generator::add_child_generator
            ((Generator *)uVar4,(string *)((long)&src_parent.field_2 + 8),
             (shared_ptr<kratos::Generator> *)local_80);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_parent);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"clk",(allocator<char> *)local_80);
  pPVar6 = kratos::Generator::port(pGVar5,In,(string *)((long)&src_parent.field_2 + 8),1,Clock);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"rst",(allocator<char> *)local_80);
  pPVar7 = kratos::Generator::port(pGVar5,In,(string *)((long)&src_parent.field_2 + 8),1,AsyncReset)
  ;
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  kratos::Generator::wire
            ((Generator *)uVar4,&pPVar6->super_Var,
             (Var *)attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  kratos::Generator::wire((Generator *)uVar4,&pPVar7->super_Var,&local_118->super_Var);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"a",(allocator<char> *)local_80);
  kratos::Generator::var(pGVar5,(string *)((long)&src_parent.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"b",(allocator<char> *)local_80);
  pVVar8 = kratos::Generator::var(pGVar5,(string *)((long)&src_parent.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"c",(allocator<char> *)local_80);
  local_110 = kratos::Generator::var(pGVar5,(string *)((long)&src_parent.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  kratos::Generator::sequential((Generator *)local_80);
  auVar3 = local_80;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_c8,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar6->super_Var).super_enable_shared_from_this<kratos::Var>);
  src_parent.field_2._8_4_ = 0;
  src._M_t._M_impl._0_8_ = auStack_c8;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = src_child._M_dataplus._M_p;
  auStack_c8 = (undefined1  [8])0x0;
  src_child._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)auVar3,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&src_parent.field_2 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src._M_t._M_impl.super__Rb_tree_header);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)((long)&src_parent.field_2 + 8));
  pIVar2 = (IfStmt *)CONCAT44(src_parent.field_2._12_4_,src_parent.field_2._8_4_);
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)((long)&src_child.field_2 + 8),pVVar8);
  auStack_c8 = (undefined1  [8])src_child.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_child.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt(pIVar2,(shared_ptr<kratos::Stmt> *)auStack_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  pIVar2 = (IfStmt *)CONCAT44(src_parent.field_2._12_4_,src_parent.field_2._8_4_);
  kratos::Var::assign((Var *)((long)&src_child.field_2 + 8),local_110);
  auStack_c8 = (undefined1  [8])src_child.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_child.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_else_stmt(pIVar2,(shared_ptr<kratos::Stmt> *)auStack_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  auVar3 = local_80;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)auStack_c8,
             (__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
             ((long)&src_parent.field_2 + 8));
  kratos::StmtBlock::add_stmt((StmtBlock *)auVar3,(shared_ptr<kratos::Stmt> *)auStack_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_parent);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"child2",(allocator<char> *)local_80);
  pGVar5 = kratos::Context::generator
                     ((Context *)local_260,(string *)((long)&src_parent.field_2 + 8));
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"child2",(allocator<char> *)local_80);
  kratos::Generator::add_child_generator
            ((Generator *)src_child2.field_2._8_8_,(string *)((long)&src_parent.field_2 + 8),pGVar5)
  ;
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"clk",(allocator<char> *)local_80);
  pPVar6 = kratos::Generator::port(pGVar5,In,(string *)((long)&src_parent.field_2 + 8),1,Clock);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"rst",(allocator<char> *)local_80);
  pPVar7 = kratos::Generator::port(pGVar5,In,(string *)((long)&src_parent.field_2 + 8),1,AsyncReset)
  ;
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  uVar4 = src_child2.field_2._8_8_;
  kratos::Generator::wire
            ((Generator *)src_child2.field_2._8_8_,&pPVar6->super_Var,
             (Var *)attr.super___shared_ptr<kratos::Attribute,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi);
  kratos::Generator::wire((Generator *)uVar4,&pPVar7->super_Var,&local_118->super_Var);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"a",(allocator<char> *)local_80);
  pVVar8 = kratos::Generator::var(pGVar5,(string *)((long)&src_parent.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"b",(allocator<char> *)local_80);
  local_118 = (Port *)kratos::Generator::var(pGVar5,(string *)((long)&src_parent.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"c",(allocator<char> *)local_80);
  var = kratos::Generator::var(pGVar5,(string *)((long)&src_parent.field_2 + 8),1);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_parent.field_2._M_local_buf + 8),"flush",(allocator<char> *)local_80);
  pPVar7 = kratos::Generator::port(pGVar5,In,(string *)((long)&src_parent.field_2 + 8),1,Reset);
  std::__cxx11::string::~string((string *)(src_parent.field_2._M_local_buf + 8));
  right = kratos::Const::constant(1,1,false);
  kratos::Generator::wire
            ((Generator *)src_child2.field_2._8_8_,&pPVar7->super_Var,&right->super_Var);
  kratos::Generator::sequential((Generator *)local_80);
  auVar3 = local_80;
  local_110 = pVVar8;
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)auStack_c8,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(pPVar6->super_Var).super_enable_shared_from_this<kratos::Var>);
  src_parent.field_2._8_4_ = 0;
  src._M_t._M_impl._0_8_ = auStack_c8;
  src._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = src_child._M_dataplus._M_p;
  auStack_c8 = (undefined1  [8])0x0;
  src_child._M_dataplus._M_p = (pointer)0x0;
  kratos::SequentialStmtBlock::add_condition
            ((SequentialStmtBlock *)auVar3,
             (pair<kratos::EventEdgeType,_std::shared_ptr<kratos::Var>_> *)
             ((long)&src_parent.field_2 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src._M_t._M_impl.super__Rb_tree_header);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)((long)&src_parent.field_2 + 8));
  pIVar2 = (IfStmt *)CONCAT44(src_parent.field_2._12_4_,src_parent.field_2._8_4_);
  kratos::Const::constant(0,1,false);
  kratos::Var::assign((Var *)((long)&src_child.field_2 + 8),&local_118->super_Var);
  auStack_c8 = (undefined1  [8])src_child.field_2._8_8_;
  src_child._M_dataplus = src_child2._M_dataplus;
  src_child.field_2._8_8_ = 0;
  src_child2._M_dataplus._M_p = (pointer)0x0;
  kratos::IfStmt::add_then_stmt(pIVar2,(shared_ptr<kratos::Stmt> *)auStack_c8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  std::make_shared<kratos::IfStmt,kratos::Port&>((Port *)auStack_c8);
  auVar3 = auStack_c8;
  kratos::Const::constant(1,1,false);
  kratos::Var::assign((Var *)auStack_e8,var);
  src_child.field_2._8_8_ = auStack_e8;
  src_child2._M_dataplus._M_p = (pointer)gtest_ar__5._0_8_;
  auStack_e8 = (undefined1  [8])0x0;
  gtest_ar__5.success_ = false;
  gtest_ar__5._1_7_ = 0;
  kratos::IfStmt::add_then_stmt
            ((IfStmt *)auVar3,(shared_ptr<kratos::Stmt> *)((long)&src_child.field_2 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar__5);
  auVar3 = auStack_c8;
  kratos::Var::assign((Var *)auStack_e8,var);
  src_child.field_2._8_8_ = auStack_e8;
  src_child2._M_dataplus._M_p = (pointer)gtest_ar__5._0_8_;
  auStack_e8 = (undefined1  [8])0x0;
  gtest_ar__5.success_ = false;
  gtest_ar__5._1_7_ = 0;
  kratos::IfStmt::add_else_stmt
            ((IfStmt *)auVar3,(shared_ptr<kratos::Stmt> *)((long)&src_child.field_2 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&gtest_ar__5);
  pIVar2 = (IfStmt *)CONCAT44(src_parent.field_2._12_4_,src_parent.field_2._8_4_);
  p_Var1 = (__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)((long)&src_child.field_2 + 8);
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            (p_Var1,(__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)auStack_c8);
  kratos::IfStmt::add_else_stmt(pIVar2,(shared_ptr<kratos::Stmt> *)p_Var1);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  auVar3 = local_80;
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::IfStmt,void>
            (p_Var1,(__shared_ptr<kratos::IfStmt,_(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&src_parent.field_2 + 8));
  kratos::StmtBlock::add_stmt((StmtBlock *)auVar3,(shared_ptr<kratos::Stmt> *)p_Var1);
  uVar4 = src_child2.field_2._8_8_;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child2);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_child);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&src_parent);
  std::make_shared<kratos::Attribute>();
  std::__cxx11::string::assign((char *)((long)local_138 + 0x28));
  std::vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
  ::emplace_back<std::shared_ptr<kratos::Attribute>const&>
            ((vector<std::shared_ptr<kratos::Attribute>,std::allocator<std::shared_ptr<kratos::Attribute>>>
              *)(uVar4 + 0x50),(shared_ptr<kratos::Attribute> *)local_138);
  kratos::auto_insert_sync_reset((Generator *)uVar4);
  kratos::fix_assignment_type((Generator *)uVar4);
  kratos::create_module_instantiation((Generator *)uVar4);
  kratos::generate_verilog_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)((long)&src_parent.field_2 + 8),(kratos *)uVar4,top);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"parent",(allocator<char> *)(src_child.field_2._M_local_buf + 8));
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&src_parent.field_2 + 8),(key_type *)local_80);
  auStack_c8[0] =
       (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)(iVar9._M_node != (_Base_ptr)&src);
  src_child._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)local_80);
  if (auStack_c8[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)((long)&src_child.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)auStack_c8,
               (AssertionResult *)"src.find(\"parent\") != src.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x142,(char *)local_80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)auStack_e8,(Message *)((long)&src_child.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_e8);
    std::__cxx11::string::~string((string *)local_80);
    if (src_child.field_2._8_8_ != 0) {
      (**(code **)(*(long *)src_child.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&src_child);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"child",(allocator<char> *)(src_child.field_2._M_local_buf + 8));
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&src_parent.field_2 + 8),(key_type *)local_80);
  auStack_c8[0] =
       (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)(iVar9._M_node != (_Base_ptr)&src);
  src_child._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)local_80);
  if (auStack_c8[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)((long)&src_child.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)auStack_c8,
               (AssertionResult *)"src.find(\"child\") != src.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x143,(char *)local_80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)auStack_e8,(Message *)((long)&src_child.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_e8);
    std::__cxx11::string::~string((string *)local_80);
    if (src_child.field_2._8_8_ != 0) {
      (**(code **)(*(long *)src_child.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&src_child);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_80,"child2",(allocator<char> *)(src_child.field_2._M_local_buf + 8));
  iVar9 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&src_parent.field_2 + 8),(key_type *)local_80);
  auStack_c8[0] =
       (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)(iVar9._M_node != (_Base_ptr)&src);
  src_child._M_dataplus._M_p = (pointer)0x0;
  std::__cxx11::string::~string((string *)local_80);
  if (auStack_c8[0] == (__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>)0x0) {
    testing::Message::Message((Message *)((long)&src_child.field_2 + 8));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)auStack_c8,
               (AssertionResult *)"src.find(\"child2\") != src.end()","false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)auStack_e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x144,(char *)local_80);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)auStack_e8,(Message *)((long)&src_child.field_2 + 8));
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)auStack_e8);
    std::__cxx11::string::~string((string *)local_80);
    if (src_child.field_2._8_8_ != 0) {
      (**(code **)(*(long *)src_child.field_2._8_8_ + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&src_child);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_c8,"parent",(allocator<char> *)(src_child.field_2._M_local_buf + 8));
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&src_parent.field_2 + 8),(key_type *)auStack_c8);
  std::__cxx11::string::string((string *)local_80,(string *)pmVar10);
  std::__cxx11::string::~string((string *)auStack_c8);
  lVar11 = std::__cxx11::string::find(local_80,0x21f594);
  src_child2._M_dataplus._M_p = (pointer)0x0;
  src_child.field_2._M_local_buf[8] = lVar11 != -1;
  if (lVar11 == -1) {
    testing::Message::Message((Message *)auStack_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_c8,(internal *)(src_child.field_2._M_local_buf + 8),
               (AssertionResult *)
               "src_parent.find(\"else if (flush) begin\\n\" \"    b <= 1\'h0;\\n\" \"  end\") != std::string::npos"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x148,(char *)auStack_c8);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)auStack_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)auStack_c8);
    if (auStack_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)auStack_e8 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&src_child2);
  lVar11 = std::__cxx11::string::find(local_80,0x21f61a);
  src_child2._M_dataplus._M_p = (pointer)0x0;
  src_child.field_2._M_local_buf[8] = lVar11 != -1;
  if (lVar11 == -1) {
    testing::Message::Message((Message *)auStack_e8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_c8,(internal *)(src_child.field_2._M_local_buf + 8),
               (AssertionResult *)
               "src_parent.find(\"child2 child2 (\\n\" \"  .clk(clk),\\n\" \"  .flush(flush),\") != std::string::npos"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_108,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x14b,(char *)auStack_c8);
    testing::internal::AssertHelper::operator=(&local_108,(Message *)auStack_e8);
    testing::internal::AssertHelper::~AssertHelper(&local_108);
    std::__cxx11::string::~string((string *)auStack_c8);
    if (auStack_e8 != (undefined1  [8])0x0) {
      (**(code **)(*(_func_int **)auStack_e8 + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&src_child2);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(src_child.field_2._M_local_buf + 8),"child",(allocator<char> *)auStack_e8);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&src_parent.field_2 + 8),(key_type *)((long)&src_child.field_2 + 8));
  std::__cxx11::string::string((string *)auStack_c8,(string *)pmVar10);
  std::__cxx11::string::~string((string *)(src_child.field_2._M_local_buf + 8));
  lVar11 = std::__cxx11::string::find(auStack_c8,0x21f6a6);
  gtest_ar__5.success_ = false;
  gtest_ar__5._1_7_ = 0;
  auStack_e8[0] = lVar11 != -1;
  if (lVar11 == -1) {
    testing::Message::Message((Message *)&local_108);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)((long)&src_child.field_2 + 8),(internal *)auStack_e8,
               (AssertionResult *)
               "src_child.find(\"else if (flush) begin\\n\" \"    b <= 1\'h0;\") != std::string::npos"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar__6.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x14e,(char *)src_child.field_2._8_8_);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)&gtest_ar__6.message_,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__6.message_);
    std::__cxx11::string::~string((string *)(src_child.field_2._M_local_buf + 8));
    if ((long *)CONCAT71(local_108.data_._1_7_,local_108.data_._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_108.data_._1_7_,local_108.data_._0_1_) + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar__5);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)auStack_e8,"child2",(allocator<char> *)&local_108);
  pmVar10 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)((long)&src_parent.field_2 + 8),(key_type *)auStack_e8);
  std::__cxx11::string::string((string *)(src_child.field_2._M_local_buf + 8),(string *)pmVar10);
  std::__cxx11::string::~string((string *)auStack_e8);
  lVar11 = std::__cxx11::string::find(src_child.field_2._M_local_buf + 8,0x21f71b);
  gtest_ar__6.success_ = false;
  gtest_ar__6._1_7_ = 0;
  local_108.data_._0_1_ = (allocator<char>)(lVar11 != -1);
  if (!(bool)local_108.data_._0_1_) {
    testing::Message::Message((Message *)&gtest_ar__6.message_);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)auStack_e8,(internal *)&local_108,
               (AssertionResult *)
               "src_child2.find(\"else if (flush) begin\\n\" \"    c <= 1\'h1;\") != std::string::npos"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/Kuree[P]kratos/tests/test_optimize.cc"
               ,0x151,(char *)auStack_e8);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&gtest_ar__6.message_);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    std::__cxx11::string::~string((string *)auStack_e8);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar__6.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl !=
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)gtest_ar__6.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gtest_ar__6);
  std::__cxx11::string::~string((string *)(src_child.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)auStack_c8);
  std::__cxx11::string::~string((string *)local_80);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)((long)&src_parent.field_2 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&attr);
  kratos::Context::~Context((Context *)local_260);
  return;
}

Assistant:

TEST(pass, insert_sync_reset) {  // NOLINT
    Context c;
    auto &parent = c.generator("parent");
    auto &clk = parent.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst = parent.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    auto &clk_en = parent.port(PortDirection::In, "clk_en", 1, PortType::ClockEnable);
    auto &a = parent.port(PortDirection::Out, "a", 1);
    auto &b = parent.var("b", 1);
    auto &c_ = parent.var("c", 1);

    // this is the one with reset logic
    {
        auto seq_parent = parent.sequential();
        seq_parent->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
        auto if_seq_parent = std::make_shared<IfStmt>(rst);
        if_seq_parent->add_then_stmt(b.assign(constant(0, 1)));
        if_seq_parent->add_else_stmt(c_.assign(a));
        seq_parent->add_stmt(if_seq_parent);
    }

    // this is the one with both reset and clock enable
    {
        auto seq_parent = parent.sequential();
        seq_parent->add_condition({EventEdgeType::Posedge, clk.shared_from_this()});
        auto if_seq_parent = std::make_shared<IfStmt>(rst);
        if_seq_parent->add_then_stmt(b.assign(constant(0, 1)));
        auto if_clk_en = std::make_shared<IfStmt>(clk_en);
        if_clk_en->add_then_stmt(c_.assign(a));
        if_seq_parent->add_else_stmt(if_clk_en);
        seq_parent->add_stmt(if_seq_parent);
    }

    // test child wiring
    auto &child = c.generator("child");
    parent.add_child_generator("child", child.shared_from_this());
    auto &clk_child = child.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst_child = child.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    parent.wire(clk_child, clk);
    parent.wire(rst_child, rst);
    {
        auto &a_child = child.var("a", 1);
        auto &b_child = child.var("b", 1);
        auto &c_child = child.var("c", 1);
        auto seq_child = child.sequential();
        seq_child->add_condition({EventEdgeType::Posedge, clk_child.shared_from_this()});
        // same thing as the parent
        auto if_seq_child = std::make_shared<IfStmt>(rst_child);
        if_seq_child->add_then_stmt(b_child.assign(constant(0, 1)));
        if_seq_child->add_else_stmt(c_child.assign(a_child));
        seq_child->add_stmt(if_seq_child);
    }

    // this child already has it's own flush logic
    auto &child2 = c.generator("child2");
    parent.add_child_generator("child2", child2);
    auto &clk_child2 = child2.port(PortDirection::In, "clk", 1, PortType::Clock);
    auto &rst_child2 = child2.port(PortDirection::In, "rst", 1, PortType::AsyncReset);
    parent.wire(clk_child2, clk);
    parent.wire(rst_child2, rst);
    {
        auto &a_child = child2.var("a", 1);
        auto &b_child = child2.var("b", 1);
        auto &c_child = child2.var("c", 1);
        auto &flush = child2.port(PortDirection::In, "flush", 1, PortType::Reset);
        parent.wire(flush, constant(1, 1));
        auto seq_child = child2.sequential();
        seq_child->add_condition({EventEdgeType::Posedge, clk_child2.shared_from_this()});
        // same thing as the parent
        auto if_seq_child = std::make_shared<IfStmt>(rst_child2);
        if_seq_child->add_then_stmt(b_child.assign(constant(0, 1)));
        auto if_2 = std::make_shared<IfStmt>(flush);
        if_2->add_then_stmt(c_child.assign(constant(1, 1)));
        if_2->add_else_stmt(c_child.assign(a_child));
        if_seq_child->add_else_stmt(if_2);
        seq_child->add_stmt(if_seq_child);
    }

    // add attribute
    auto attr = std::make_shared<Attribute>();
    attr->value_str = "sync-reset=flush;over_clk_en=false";
    parent.add_attribute(attr);
    auto_insert_sync_reset(&parent);
    fix_assignment_type(&parent);
    create_module_instantiation(&parent);

    auto src = generate_verilog(&parent);
    EXPECT_TRUE(src.find("parent") != src.end());
    EXPECT_TRUE(src.find("child") != src.end());
    EXPECT_TRUE(src.find("child2") != src.end());
    auto src_parent = src.at("parent");
    EXPECT_TRUE(src_parent.find("else if (flush) begin\n"
                                "    b <= 1'h0;\n"
                                "  end") != std::string::npos);
    EXPECT_TRUE(src_parent.find("child2 child2 (\n"
                                "  .clk(clk),\n"
                                "  .flush(flush),") != std::string::npos);
    auto src_child = src.at("child");
    EXPECT_TRUE(src_child.find("else if (flush) begin\n"
                               "    b <= 1'h0;") != std::string::npos);
    auto src_child2 = src.at("child2");
    EXPECT_TRUE(src_child2.find("else if (flush) begin\n"
                                "    c <= 1'h1;") != std::string::npos);
}